

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

void gl4cts::SparseTextureUtils::getTextureLevelSize
               (GLint target,TextureState *state,GLint level,GLint *width,GLint *height,GLint *depth
               )

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  iVar1 = state->width;
  dVar3 = ldexp(1.0,level);
  *width = iVar1 / (int)dVar3;
  iVar2 = 1;
  iVar1 = 1;
  if ((target != 0xde0) && (target != 0x8c18)) {
    iVar1 = state->height;
    dVar3 = ldexp(1.0,level);
    iVar1 = iVar1 / (int)dVar3;
  }
  *height = iVar1;
  if (target < 0x8c1a) {
    if (target == 0x806f) {
      iVar2 = state->depth;
      dVar3 = ldexp(1.0,level);
      iVar2 = iVar2 / (int)dVar3;
      goto LAB_00a5bd29;
    }
    if (target != 0x8c18) goto LAB_00a5bd29;
  }
  else if ((target != 0x8c1a) && (target != 0x9009)) goto LAB_00a5bd29;
  iVar2 = state->depth;
LAB_00a5bd29:
  *depth = iVar2;
  return;
}

Assistant:

void SparseTextureUtils::getTextureLevelSize(GLint target, TextureState& state, GLint level, GLint& width,
											 GLint& height, GLint& depth)
{
	width = state.width / (int)pow(2, level);
	if (target == GL_TEXTURE_1D || target == GL_TEXTURE_1D_ARRAY)
		height = 1;
	else
		height = state.height / (int)pow(2, level);

	if (target == GL_TEXTURE_3D)
		depth = state.depth / (int)pow(2, level);
	else if (target == GL_TEXTURE_1D_ARRAY || target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY)
		depth = state.depth;
	else
		depth = 1;
}